

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::RecGroupEquator::eq(RecGroupEquator *this,Struct *a,Struct *b)

{
  bool bVar1;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  Struct *b_local;
  Struct *a_local;
  RecGroupEquator *this_local;
  
  __first1 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(&a->fields);
  __last1 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(&a->fields);
  __first2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::begin(&b->fields);
  __last2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::end(&b->fields);
  bVar1 = std::
          equal<__gnu_cxx::__normal_iterator<wasm::Field_const*,std::vector<wasm::Field,std::allocator<wasm::Field>>>,__gnu_cxx::__normal_iterator<wasm::Field_const*,std::vector<wasm::Field,std::allocator<wasm::Field>>>,wasm::(anonymous_namespace)::RecGroupEquator::eq(wasm::Struct_const&,wasm::Struct_const&)const::__0>
                    ((__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      )__first1._M_current,
                     (__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      )__last1._M_current,
                     (__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      )__first2._M_current,
                     (__normal_iterator<const_wasm::Field_*,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      )__last2._M_current,(anon_class_8_1_8991fb9c)this);
  return bVar1;
}

Assistant:

bool RecGroupEquator::eq(const Struct& a, const Struct& b) const {
  return std::equal(a.fields.begin(),
                    a.fields.end(),
                    b.fields.begin(),
                    b.fields.end(),
                    [&](const Field& x, const Field& y) { return eq(x, y); });
}